

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_details.cxx
# Opt level: O0

void __thiscall xray_re::details_header::save(details_header *this,xr_writer *w)

{
  xr_writer *w_local;
  details_header *this_local;
  
  xr_writer::w_u32(w,this->version);
  xr_writer::w_u32(w,this->object_count);
  xr_writer::w_s32(w,this->offs_x);
  xr_writer::w_s32(w,this->offs_z);
  xr_writer::w_u32(w,this->size_x);
  xr_writer::w_u32(w,this->size_z);
  return;
}

Assistant:

void details_header::save(xr_writer& w) const
{
	w.w_u32(version);
	w.w_u32(object_count);
	w.w_s32(offs_x);
	w.w_s32(offs_z);
	w.w_u32(size_x);
	w.w_u32(size_z);
}